

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ProgramSharingTest::createResource(GLES2ProgramSharingTest *this)

{
  char *pcVar1;
  bool bVar2;
  ShaderProgram *this_00;
  TestError *this_01;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_111;
  string local_110;
  ProgramSources local_f0;
  char *local_20;
  char *fragmentShader;
  char *vertexShader;
  GLES2ProgramSharingTest *this_local;
  
  fragmentShader =
       "attribute mediump vec2 a_pos;\nattribute mediump vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main(void)\n{\n\tv_color = a_color;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
  ;
  local_20 = "varying mediump vec4 v_color;\nvoid main(void)\n{\n\tgl_FragColor = v_color;\n}\n";
  vertexShader = (char *)this;
  this_00 = (ShaderProgram *)operator_new(0xd0);
  pcVar1 = fragmentShader;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,pcVar1,&local_111);
  pcVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,pcVar1,&local_149);
  glu::makeVtxFragSources(&local_f0,&local_110,&local_148);
  glu::ShaderProgram::ShaderProgram(this_00,&(this->super_GLES2SharingTest).m_gl,&local_f0);
  this->m_program = this_00;
  glu::ProgramSources::~ProgramSources(&local_f0);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  bVar2 = glu::ShaderProgram::isOk(this->m_program);
  if (!bVar2) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Failed to compile shader program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
               ,0x2a0);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void GLES2ProgramSharingTest::createResource (void)
{
	const char* vertexShader = ""
	"attribute mediump vec2 a_pos;\n"
	"attribute mediump vec4 a_color;\n"
	"varying mediump vec4 v_color;\n"
	"void main(void)\n"
	"{\n"
	"\tv_color = a_color;\n"
	"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
	"}\n";

	const char* fragmentShader = ""
	"varying mediump vec4 v_color;\n"
	"void main(void)\n"
	"{\n"
	"\tgl_FragColor = v_color;\n"
	"}\n";

	m_program = new glu::ShaderProgram(m_gl, glu::makeVtxFragSources(vertexShader, fragmentShader));

	if (!m_program->isOk())
		TCU_FAIL("Failed to compile shader program");
}